

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

void gameTick(int *isOnGround,int *isOnStairs)

{
  int *piVar1;
  EActorType EVar2;
  Actor *pAVar3;
  Actor *a;
  Item *b;
  void *item;
  bool bVar4;
  void **ppvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vec2i *item_00;
  uint uVar9;
  EDirection EVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  undefined1 auVar15 [16];
  Vec2i VVar16;
  Vec2i VVar17;
  allocator local_51;
  string local_50;
  
  counter = counter + 1;
  if (screen != kGame) {
    return;
  }
  updateTimers();
  if (player.mHealth == 0) {
    screen = kGameOver;
    prepareScreenFor(kGameOver);
    return;
  }
  if (player.mStance == kAttacking) {
    evaluatePlayerAttack();
    player.mStance = kStanding;
  }
  *isOnStairs = (uint)(foregroundTiles[(player.mPosition.mY + 0x10) / 0x20]
                       [(player.mPosition.mX + 0x10) / 0x20] == 3);
  iVar6 = isBlockedByWall(&player);
  if (iVar6 != 0) {
    player.mSpeed.mX = 0;
  }
  iVar6 = isOnHarmfulBlock(&player);
  if ((iVar6 != 0) && (ticksUntilVulnerable < 1)) {
    hurtPlayer(1);
  }
  iVar6 = isOnDoor(&player);
  if (iVar6 != 0) {
    advanceFloor();
  }
  VVar16.mX = player.mPosition.mX + player.mSpeed.mX;
  VVar16.mY = player.mPosition.mY + player.mSpeed.mY;
  if (player.mSpeed.mX == 1) {
    player.mSpeed.mX = 0;
  }
  if (player.mSpeed.mY == 1) {
    player.mSpeed.mY = 0;
  }
  player.mPosition = VVar16;
  enforceScreenLimits();
  if (((player.mSpeed.mX == 0) && (player.mSpeed.mY == 0)) && (player.mStance != kAltAttacking)) {
    heroFrame = 0;
  }
  uVar11 = player.mPosition.mY / 0x20;
  iVar6 = isOnFloor(&player);
  *isOnGround = iVar6;
  bVar4 = *isOnStairs != 0;
  player.mStance = kClimbing;
  if (*isOnStairs == 0) {
    player.mStance = kJumping;
  }
  else {
    player.mSpeed.mX = 0;
    iVar6 = *isOnGround;
  }
  if ((iVar6 != 0) || (*isOnStairs == 0)) {
    player.mStance = kStanding;
    if (player.mSpeed.mX == 0) {
      heroFrame = 0;
    }
    bVar4 = false;
  }
  uVar9 = 0;
  if ((int)uVar11 < 1) {
    uVar11 = uVar9;
  }
  if ((bool)(player.mSpeed.mY != 0 & bVar4)) {
    heroFrame = (heroFrame + 1) % 2;
  }
  if (player.mSpeed.mX != 0) {
    if (*isOnGround == 0) goto LAB_00104258;
    heroFrame = (heroFrame + 1) % 2;
    uVar9 = player.mSpeed.mX / 2;
  }
  if (*isOnGround != 0) {
    player.mPosition.mY = player.mPosition.mY / 0x20 << 5;
    player.mSpeed.mX = uVar9;
    if ((*isOnGround != 0) && (*isOnStairs == 0)) {
      player.mSpeed.mY = min(0,player.mSpeed.mY);
      iVar6 = min(player.mPosition.mY,player.mPosition.mY / 0x20 << 5);
      player.mPosition.mY = iVar6;
    }
  }
LAB_00104258:
  if (player.mSpeed.mY < 0) {
    iVar6 = (player.mPosition.mX + 0x10) / 0x20;
    if ((foregroundTiles[uVar11][iVar6] == 1) ||
       (foregroundTiles[player.mPosition.mY / 0x20][iVar6] == 1)) {
      player.mSpeed.mY = -player.mSpeed.mY;
    }
  }
  player.mSpeed.mY = player.mSpeed.mY + 2;
  uVar12 = 0;
  if (*isOnStairs != 0) {
    player.mSpeed.mY = 0;
  }
  for (; ppvVar5 = arrows.items, uVar12 < arrows.used; uVar12 = uVar12 + 1) {
    pAVar3 = (Actor *)arrows.items[uVar12];
    if ((pAVar3 != (Actor *)0x0) && (pAVar3->mActive != 0)) {
      VVar17.mX = (pAVar3->mPosition).mX + (pAVar3->mSpeed).mX;
      VVar17.mY = (pAVar3->mPosition).mY + (pAVar3->mSpeed).mY;
      pAVar3->mPosition = VVar17;
      auVar15._0_4_ = -(uint)(-0x7ffffec1 < (int)(VVar17.mX ^ 0x80000000));
      auVar15._4_4_ = -(uint)(-0x7ffffec1 < (int)(VVar17.mX ^ 0x80000000));
      auVar15._8_4_ = -(uint)(-0x7fffff39 < (int)(VVar17.mY ^ 0x80000000));
      auVar15._12_4_ = -(uint)(-0x7fffff39 < (int)(VVar17.mY ^ 0x80000000));
      iVar6 = movmskpd((int)ppvVar5,auVar15);
      if ((iVar6 == 0) && (iVar6 = isBlockedByWall(pAVar3), iVar6 == 0)) {
        for (uVar13 = 0; uVar13 < foes.used; uVar13 = uVar13 + 1) {
          a = (Actor *)foes.items[uVar13];
          if ((((a != (Actor *)0x0) && (a->mActive != 0)) && (a->mType != kHand)) &&
             (iVar6 = collideActorActor(a,pAVar3,0x20), iVar6 != 0)) {
            a->mHealth = a->mHealth + -1;
            removeFromVector(&arrows,pAVar3);
            free(pAVar3);
            if (a->mType == kGargoyle) {
              openAllDoors();
            }
          }
        }
      }
      else {
        removeFromVector(&arrows,pAVar3);
        free(pAVar3);
      }
    }
  }
  for (uVar12 = 0; uVar12 < items.used; uVar12 = uVar12 + 1) {
    b = (Item *)items.items[uVar12];
    if (((b != (Item *)0x0) && (b->mActive != 0)) &&
       (iVar6 = collideActorItem(&player,b,0x20), iVar6 != 0)) {
      if ((b->mType == kKey) && (hasKey == 0)) {
        hasKey = 1;
        b->mActive = 0;
        std::__cxx11::string::string((string *)&local_50,pickSound,&local_51);
        playTune(&local_50);
        std::__cxx11::string::_M_dispose();
        openAllDoors();
      }
      else if (b->mType == kMeat) {
        if (player.mHealth < 10) {
          std::__cxx11::string::string((string *)&local_50,pickSound,&local_51);
          playTune(&local_50);
          std::__cxx11::string::_M_dispose();
          b->mActive = 0;
          player.mHealth = 10;
          std::__cxx11::string::string((string *)&local_50,pickSound,&local_51);
          playTune(&local_50);
          std::__cxx11::string::_M_dispose();
        }
        ticksToShowHealth = 0xe;
      }
    }
  }
  uVar12 = 0;
  do {
    if (foes.used <= uVar12) {
      uVar12 = foes.used;
      for (uVar13 = 0; uVar13 < uVar12; uVar13 = uVar13 + 1) {
        item = foes.items[uVar13];
        if (((item != (void *)0x0) && (*(int *)((long)item + 0x10) != 5)) &&
           (*(int *)((long)item + 0x1c) < 1)) {
          removeFromVector(&foes,item);
          uVar12 = foes.used;
        }
      }
      return;
    }
    pAVar3 = (Actor *)foes.items[uVar12];
    if ((pAVar3 != (Actor *)0x0) && (pAVar3->mActive != 0)) {
      EVar2 = pAVar3->mType;
      if (EVar2 == kSpawner) {
        if ((foes.used < 6) && (counter % 0x28 == 0)) {
          item_00 = (Vec2i *)calloc(1,0x24);
          pushVector(&foes,item_00);
          item_00[2].mX = 1;
          item_00[1].mX = 8;
          *item_00 = pAVar3->mPosition;
          item_00[2].mY = 1;
          *(undefined8 *)&item_00[3].mY = 0x100000002;
        }
      }
      else if ((EVar2 == kHand) && (counter % 5 == 0)) {
        iVar6 = (pAVar3->mPosition).mX;
        uVar11 = -(uint)(iVar6 < player.mPosition.mX);
        uVar9 = -(uint)((pAVar3->mPosition).mY < player.mPosition.mY);
        pAVar3->mSpeed =
             (Vec2i)(CONCAT44(uVar9 >> 0x1f,uVar11 >> 0x1f) |
                    CONCAT44(uVar9,uVar11) ^ (ulong)DAT_00106260);
        if (pAVar3->mDirection == kDirectionRight) {
          if (0x9f < iVar6) goto LAB_001045c6;
        }
        else if ((pAVar3->mDirection == kDirectionLeft) && (iVar6 < 0xa0)) {
LAB_001045c6:
          (pAVar3->mSpeed).mX = uVar11 | 1;
        }
LAB_001045d1:
        if (pAVar3->mHealth < 1) {
          pAVar3->mActive = 0;
          if (EVar2 == kTinhoso) {
            hasBossOnScreen = 0;
            clearVector(&doors);
          }
          else if (EVar2 == kCapiroto) {
            screen = kVictory;
            prepareScreenFor(kVictory);
            return;
          }
        }
        else if ((EVar2 | kCapiroto) == kHand) {
          iVar6 = (pAVar3->mSpeed).mX;
          iVar14 = (pAVar3->mSpeed).mY;
          iVar7 = (pAVar3->mPosition).mX + iVar6;
          (pAVar3->mPosition).mX = iVar7;
          piVar1 = &(pAVar3->mPosition).mY;
          *piVar1 = *piVar1 + iVar14;
          EVar10 = kDirectionLeft;
          iVar8 = -8;
          if (iVar7 < 0x120) {
            EVar10 = kDirectionRight;
            iVar8 = 8;
            if (iVar7 < 0) goto LAB_00104614;
          }
          else {
LAB_00104614:
            iVar6 = iVar8;
            (pAVar3->mSpeed).mX = iVar6;
            pAVar3->mDirection = EVar10;
          }
          iVar8 = isBlockedByWall(pAVar3);
          if (iVar8 != 0) {
            (pAVar3->mSpeed).mX = -iVar6;
            pAVar3->mDirection = (uint)(pAVar3->mDirection == kDirectionLeft);
          }
          if ((ticksUntilVulnerable < 1) &&
             (iVar6 = collideActorActor(pAVar3,&player,0x10), iVar6 != 0)) {
            hurtPlayer(1);
            iVar14 = (pAVar3->mSpeed).mY;
          }
          (pAVar3->mSpeed).mY = iVar14 + 2;
          iVar6 = isOnFloor(pAVar3);
          if (iVar6 != 0) {
            (pAVar3->mSpeed).mY = 0;
            (pAVar3->mPosition).mY = (pAVar3->mPosition).mY / 0x20 << 5;
          }
        }
      }
      else if ((EVar2 < (kCapiroto|kClosedDoor)) && ((0x342U >> (EVar2 & 0x1f) & 1) != 0))
      goto LAB_001045d1;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void gameTick(int *isOnGround, int *isOnStairs) {
	int ceiling;
	size_t pos;
	size_t pos2 = 0;

	++counter;

	if (screen != kGame) {
		return;
	}

	updateTimers();

	if (player.mHealth == 0) {
		screen = kGameOver;
		prepareScreenFor(screen);
		return;
	}

	if (player.mStance == kAttacking) {
		evaluatePlayerAttack();

		player.mStance = kStanding;
	}

	*isOnStairs = (
			foregroundTiles[(player.mPosition.mY + 16) / 32][(player.mPosition.mX + 16) / 32] == 3);

	if (isBlockedByWall(&player)) {
		player.mSpeed.mX = 0;
	}

	if (isOnHarmfulBlock(&player) && ticksUntilVulnerable <= 0) {
		hurtPlayer(1);
	}

	if (isOnDoor(&player)) {
		advanceFloor();
	}

	player.mPosition.mX += player.mSpeed.mX;
	player.mPosition.mY += player.mSpeed.mY;

	if (player.mSpeed.mX == 1) {
		player.mSpeed.mX = 0;
	}

	if (player.mSpeed.mY == 1) {
		player.mSpeed.mY = 0;
	}

	enforceScreenLimits();

	if (player.mSpeed.mX == 0 && player.mSpeed.mY == 0 && player.mStance != kAltAttacking) {
		heroFrame = 0;
	}

	ceiling = (player.mPosition.mY) / 32;

	*isOnGround = isOnFloor(&player);

	if (*isOnStairs) {
		player.mStance = kClimbing;
		player.mSpeed.mX = 0;
	} else {
		player.mStance = kJumping;
	}

	if (*isOnGround || !*isOnStairs) {
		player.mStance = kStanding;

		if (player.mSpeed.mX == 0) {
			heroFrame = 0;
		}

	}

	if (ceiling < 0) {
		ceiling = 0;
	}

	if (player.mSpeed.mY != 0 && player.mStance == kClimbing) {
		heroFrame = (heroFrame + 1) % 2;
	}

	if ((player.mSpeed.mX != 0 && *isOnGround) || player.mStance == kAltAttacking) {
		heroFrame = (heroFrame + 1) % 2;
	}

	if (*isOnGround) {
		player.mSpeed.mX = player.mSpeed.mX / 2;
		player.mPosition.mY = (player.mPosition.mY / 32) * 32;
	}

	if (*isOnGround && !*isOnStairs) {
		player.mSpeed.mY = min(0, player.mSpeed.mY);
		player.mPosition.mY = min(player.mPosition.mY, (player.mPosition.mY / 32) * 32);
	}

	if (player.mSpeed.mY < 0 && foregroundTiles[ceiling][(player.mPosition.mX + 16) / 32] == 1) {
		player.mSpeed.mY = -player.mSpeed.mY;
	}

	if (player.mSpeed.mY < 0 &&
		foregroundTiles[player.mPosition.mY / 32][(player.mPosition.mX + 16) / 32] == 1) {
		player.mSpeed.mY = -player.mSpeed.mY;
	}

	if (!*isOnStairs) {
		player.mSpeed.mY = player.mSpeed.mY + 2;
/*this prevents from jumping while keeping the climbing animation state.
Unfortunately, prevents looking up.*/

	} else {
		player.mSpeed.mY = 0;
	}

	for (pos = 0; pos < arrows.used; ++pos) {
		struct Actor *arrow =  (struct Actor*)arrows.items[pos];

		if (arrow == NULL) {
			continue;
		}

		if (!arrow->mActive) {
			continue;
		}

		arrow->mPosition.mX += arrow->mSpeed.mX;
		arrow->mPosition.mY += arrow->mSpeed.mY;

		if (arrow->mPosition.mX >= 320 ||
			arrow->mPosition.mX < 0 ||
			arrow->mPosition.mY < 0 ||
			arrow->mPosition.mY >= 200 ||
			isBlockedByWall(arrow)) {

			removeFromVector(&arrows, arrow);
			free(arrow);
			continue;
		}

		for (pos2 = 0; pos2 < foes.used; ++pos2) {
			struct Actor *foe =  (struct Actor*)foes.items[pos2];

			if (foe == NULL || !foe->mActive) {
				continue;
			}

			if (foe->mType != kHand && collideActorActor(foe, arrow, DEFAULT_TOLERANCE)) {
				foe->mHealth--;
				removeFromVector(&arrows, arrow);
				free(arrow);


				if (foe->mType == kGargoyle) {
					openAllDoors();
				}
			}
		}
	}

	for (pos = 0; pos < items.used; ++pos) {

		struct Item *item =  (struct Item*)items.items[pos];

		if (item == NULL || !item->mActive) {
			continue;
		}

		if (collideActorItem(&player, item, DEFAULT_TOLERANCE)) {
			if (item->mType == kKey && !hasKey) {
				hasKey = TRUE;
				item->mActive = FALSE;
				playTune(pickSound);
				openAllDoors();

			} else if (item->mType == kMeat) {
				if (player.mHealth < 10) {
					playTune(pickSound);
					item->mActive = FALSE;
					player.mHealth = 10;
					playTune(pickSound);
				}
				ticksToShowHealth = 14;
			}
		}
	}

	for (pos = 0; pos < foes.used; ++pos) {
		struct Actor *foe =  (struct Actor*)foes.items[pos];

		if (foe == NULL || !foe->mActive) {
			continue;
		}

		if (foe->mType == kSpawner) {
			if ((counter % 40) == 0 && (foes.used <= 5)) {
				struct Actor *a = (struct Actor *) calloc(1, sizeof(struct Actor));
				pushVector(&foes, a);
				a->mType = kSkeleton;
				a->mSpeed.mX = 8;
				a->mPosition = foe->mPosition;
				a->mDirection = kDirectionRight;
				a->mActive = TRUE;
				a->mHealth = 2;
			}
			continue;
		}


		if ((counter % 5) == 0 && foe->mType == kHand) {
			int dx = player.mPosition.mX - foe->mPosition.mX;
			int dy = player.mPosition.mY - foe->mPosition.mY;

			if (dx > 0) {
				foe->mSpeed.mX = 1;
			} else {
				foe->mSpeed.mX = -1;
			}

			if (dy > 0) {
				foe->mSpeed.mY = 1;
			} else {
				foe->mSpeed.mY = -1;
			}

			switch (foe->mDirection) {
				case kDirectionLeft:
					if (foe->mPosition.mX < 160) {
						foe->mSpeed.mX = -foe->mSpeed.mX;
					}
					break;
				case kDirectionRight:
					if (160 <= foe->mPosition.mX) {
						foe->mSpeed.mX = -foe->mSpeed.mX;
					}
					break;
			}
		}

		if (foe->mType != kSkeleton &&
			foe->mType != kTinhoso &&
			foe->mType != kCapiroto &&
			foe->mType != kHand) {

			continue;
		}

		if (foe->mHealth <= 0) {
			foe->mActive = FALSE;

			if (foe->mType == kCapiroto) {
				screen = kVictory;
				prepareScreenFor(screen);
				return;
			} else if (foe->mType == kTinhoso) {
				hasBossOnScreen = FALSE;

				clearVector(&doors);
			}

			continue;
		}

		if (foe->mType != kSkeleton && foe->mType != kHand) {
			continue;
		}

		foe->mPosition.mX += foe->mSpeed.mX;
		foe->mPosition.mY += foe->mSpeed.mY;

		if (foe->mPosition.mX >= (320 - 32)) {
			foe->mSpeed.mX = -8;
			foe->mDirection = kDirectionLeft;
		}

		if (foe->mPosition.mX < 0) {
			foe->mSpeed.mX = 8;
			foe->mDirection = kDirectionRight;
		}

		if (isBlockedByWall(foe)) {
			foe->mSpeed.mX *= -1;

			if (foe->mDirection == kDirectionLeft) {
				foe->mDirection = kDirectionRight;
			} else {
				foe->mDirection = kDirectionLeft;
			}
		}

		if ((ticksUntilVulnerable <= 0) && collideActorActor(foe, &player, 16)) {
			hurtPlayer(1);
		}

		foe->mSpeed.mY += 2;

		if (isOnFloor(foe)) {
			foe->mSpeed.mY = 0;
			foe->mPosition.mY = (foe->mPosition.mY / 32) * 32;
		}
	}

	for (pos = 0; pos < foes.used; ++pos) {
		struct Actor *foe =  (struct Actor*)foes.items[pos];

		if (foe != NULL && foe->mType != kGargoyle && foe->mHealth <= 0) {
			removeFromVector(&foes, foe);
		}
	}
}